

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)4>_>_>
 wabt::MakeUnique<wabt::AssertModuleCommand<(wabt::CommandType)4>>(void)

{
  AssertModuleCommand<(wabt::CommandType)4> *this;
  __uniq_ptr_data<wabt::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)4>_>,_true,_true>
  in_RDI;
  
  this = (AssertModuleCommand<(wabt::CommandType)4> *)operator_new(0x38);
  memset(this,0,0x38);
  AssertModuleCommand<(wabt::CommandType)4>::AssertModuleCommand(this);
  std::
  unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)4>,std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)4>>>
  ::unique_ptr<std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)4>>,void>
            ((unique_ptr<wabt::AssertModuleCommand<(wabt::CommandType)4>,std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)4>>>
              *)in_RDI.
                super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)4>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)4>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)4>_>_>
                .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)4>_*,_false>.
                _M_head_impl,this);
  return (__uniq_ptr_data<wabt::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)4>_>,_true,_true>
          )(tuple<wabt::AssertModuleCommand<(wabt::CommandType)4>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)4>_>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::AssertModuleCommand<(wabt::CommandType)4>,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)4>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)4>_*,_std::default_delete<wabt::AssertModuleCommand<(wabt::CommandType)4>_>_>
             .super__Head_base<0UL,_wabt::AssertModuleCommand<(wabt::CommandType)4>_*,_false>.
             _M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}